

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O1

void __thiscall cppcms::impl::cgi::http::on_async_write_progress(http *this,bool completed)

{
  _Atomic_word *p_Var1;
  element_type *peVar2;
  int iVar3;
  time_t tVar4;
  connections_type *this_00;
  undefined7 in_register_00000031;
  pair<std::_Rb_tree_iterator<std::weak_ptr<cppcms::impl::cgi::http>_>,_std::_Rb_tree_iterator<std::weak_ptr<cppcms::impl::cgi::http>_>_>
  pVar5;
  key_type local_38;
  element_type *local_28;
  element_type *local_20;
  
  tVar4 = time((time_t *)0x0);
  this->time_to_die_ = this->timeout_ + tVar4;
  if ((int)CONCAT71(in_register_00000031,completed) != 0) {
    peVar2 = (this->watchdog_).
             super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    self((http *)&stack0xffffffffffffffd8);
    local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28
    ;
    local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20;
    if (local_20 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)
                 ((long)&(local_20->super_enable_shared_from_this<cppcms::impl::cgi::connection>).
                         _M_weak_this.
                         super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 4);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)
                 ((long)&(local_20->super_enable_shared_from_this<cppcms::impl::cgi::connection>).
                         _M_weak_this.
                         super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 4);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    this_00 = &peVar2->connections_;
    pVar5 = std::
            _Rb_tree<std::weak_ptr<cppcms::impl::cgi::http>,_std::weak_ptr<cppcms::impl::cgi::http>,_std::_Identity<std::weak_ptr<cppcms::impl::cgi::http>_>,_std::owner_less<std::weak_ptr<cppcms::impl::cgi::http>_>,_std::allocator<std::weak_ptr<cppcms::impl::cgi::http>_>_>
            ::equal_range(&this_00->_M_t,&local_38);
    std::
    _Rb_tree<std::weak_ptr<cppcms::impl::cgi::http>,_std::weak_ptr<cppcms::impl::cgi::http>,_std::_Identity<std::weak_ptr<cppcms::impl::cgi::http>_>,_std::owner_less<std::weak_ptr<cppcms::impl::cgi::http>_>,_std::allocator<std::weak_ptr<cppcms::impl::cgi::http>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
    if (local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = (local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*(local_38.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    if (local_20 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
    }
  }
  return;
}

Assistant:

void on_async_write_progress(bool completed)
		{
			update_time();
			if(completed)
				watchdog_->remove(self());
		}